

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidatorPushAttribute
              (xmlSchemaValidCtxtPtr vctxt,xmlNodePtr attrNode,int nodeLine,xmlChar *localName,
              xmlChar *nsName,int ownedNames,xmlChar *value,int ownedValue)

{
  int iVar1;
  xmlSchemaAttrInfoPtr pxVar2;
  int iVar3;
  xmlChar *str2;
  undefined4 in_register_0000008c;
  
  str2 = nsName;
  pxVar2 = xmlSchemaGetFreshAttrInfo(vctxt);
  if (pxVar2 == (xmlSchemaAttrInfoPtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaPushAttribute",
               "calling xmlSchemaGetFreshAttrInfo()",(xmlChar *)0x0,str2);
    iVar1 = -1;
  }
  else {
    pxVar2->node = attrNode;
    pxVar2->nodeLine = nodeLine;
    pxVar2->state = 1;
    pxVar2->localName = localName;
    pxVar2->nsName = nsName;
    if (nsName != (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(localName,(xmlChar *)"nil");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(localName,"type");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(localName,"schemaLocation");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(localName,(xmlChar *)"noNamespaceSchemaLocation");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(pxVar2->nsName,(xmlChar *)"http://www.w3.org/2000/xmlns/");
              iVar3 = 5;
            }
            else {
              iVar1 = xmlStrEqual(pxVar2->nsName,
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
              iVar3 = 4;
            }
          }
          else {
            iVar1 = xmlStrEqual(pxVar2->nsName,
                                (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
            iVar3 = 3;
          }
        }
        else {
          iVar1 = xmlStrEqual(pxVar2->nsName,(xmlChar *)"http://www.w3.org/2001/XMLSchema-instance")
          ;
          iVar3 = 1;
        }
      }
      else {
        iVar1 = xmlStrEqual(pxVar2->nsName,(xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
        iVar3 = 2;
      }
      if (iVar1 != 0) {
        pxVar2->metaType = iVar3;
      }
    }
    pxVar2->value = (xmlChar *)CONCAT44(in_register_0000008c,ownedNames);
    *(byte *)&pxVar2->flags = (byte)pxVar2->flags | 2;
    iVar1 = 0;
    if (pxVar2->metaType != 0) {
      pxVar2->state = 0x11;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaValidatorPushAttribute(xmlSchemaValidCtxtPtr vctxt,
			xmlNodePtr attrNode,
			int nodeLine,
			const xmlChar *localName,
			const xmlChar *nsName,
			int ownedNames,
			xmlChar *value,
			int ownedValue)
{
    xmlSchemaAttrInfoPtr attr;

    attr = xmlSchemaGetFreshAttrInfo(vctxt);
    if (attr == NULL) {
	VERROR_INT("xmlSchemaPushAttribute",
	    "calling xmlSchemaGetFreshAttrInfo()");
	return (-1);
    }
    attr->node = attrNode;
    attr->nodeLine = nodeLine;
    attr->state = XML_SCHEMAS_ATTR_UNKNOWN;
    attr->localName = localName;
    attr->nsName = nsName;
    if (ownedNames)
	attr->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES;
    /*
    * Evaluate if it's an XSI attribute.
    */
    if (nsName != NULL) {
	if (xmlStrEqual(localName, BAD_CAST "nil")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_NIL;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "type")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_TYPE;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "schemaLocation")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_SCHEMA_LOC;
	    }
	} else if (xmlStrEqual(localName, BAD_CAST "noNamespaceSchemaLocation")) {
	    if (xmlStrEqual(attr->nsName, xmlSchemaInstanceNs)) {
		attr->metaType = XML_SCHEMA_ATTR_INFO_META_XSI_NO_NS_SCHEMA_LOC;
	    }
	} else if (xmlStrEqual(attr->nsName, xmlNamespaceNs)) {
	    attr->metaType = XML_SCHEMA_ATTR_INFO_META_XMLNS;
	}
    }
    attr->value = value;
    if (ownedValue)
	attr->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
    if (attr->metaType != 0)
	attr->state = XML_SCHEMAS_ATTR_META;
    return (0);
}